

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_scalar_fe_space.h
# Opt level: O0

ScalarReferenceFiniteElement<double> * __thiscall
lf::uscalfe::UniformScalarFESpace<double>::ShapeFunctionLayout
          (UniformScalarFESpace<double> *this,RefEl ref_el_type)

{
  RefElType RVar1;
  runtime_error *this_00;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  UniformScalarFESpace<double> *local_20;
  UniformScalarFESpace<double> *this_local;
  element_type *peStack_10;
  RefEl ref_el_type_local;
  
  local_20 = this;
  this_local._7_1_ = ref_el_type.type_;
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&this_local + 7));
  switch(RVar1) {
  case kPoint:
    peStack_10 = std::
                 __shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                 ::get(&(this->rfs_point_p_).
                        super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                      );
    break;
  case kSegment:
    peStack_10 = std::
                 __shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                 ::get(&(this->rfs_edge_p_).
                        super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                      );
    break;
  case kTria:
    peStack_10 = std::
                 __shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                 ::get(&(this->rfs_tria_p_).
                        super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                      );
    break;
  case kQuad:
    peStack_10 = std::
                 __shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                 ::get(&(this->rfs_quad_p_).
                        super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                      );
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"Illegal entity type");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"false",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x17b,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return peStack_10;
}

Assistant:

lf::fe::ScalarReferenceFiniteElement<SCALAR> const *
UniformScalarFESpace<SCALAR>::ShapeFunctionLayout(
    lf::base::RefEl ref_el_type) const {
  // Retrieve specification of local shape functions
  switch (ref_el_type) {
    case lf::base::RefEl::kPoint(): {
      return rfs_point_p_.get();
    }
    case lf::base::RefEl::kSegment(): {
      // Null pointer valid return value: indicates that a shape function
      // description for edges is missing.
      // LF_ASSERT_MSG(rfs_edge_p_ != nullptr, "No RSF for edges!");
      return rfs_edge_p_.get();
    }
    case lf::base::RefEl::kTria(): {
      // Null pointer valid return value: indicates that a shape function
      // description for triangular cells is missing.
      // LF_ASSERT_MSG(rfs_tria_p_ != nullptr, "No RSF for triangles!");
      return rfs_tria_p_.get();
    }
    case lf::base::RefEl::kQuad(): {
      // Null pointer valid return value: indicates that a shape function
      // description for quadrilaterals is missing.
      // LF_ASSERT_MSG(rfs_quad_p_ != nullptr, "No RSF for quads!");
      return rfs_quad_p_.get();
    }
    default: {
      LF_VERIFY_MSG(false, "Illegal entity type");
    }
  }
  return nullptr;
}